

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O3

void * utm_alloc(UToolMemory *mem)

{
  int iVar1;
  void *pvVar2;
  int capacity;
  
  iVar1 = mem->idx;
  capacity = iVar1 + 1;
  utm_hasCapacity(mem,capacity);
  mem->idx = capacity;
  pvVar2 = memset((void *)((long)iVar1 * (long)mem->size + (long)mem->array),0,(long)mem->size);
  return pvVar2;
}

Assistant:

U_CAPI void * U_EXPORT2
utm_alloc(UToolMemory *mem) {
    char *p=NULL;
    int32_t oldIndex=mem->idx;
    int32_t newIndex=oldIndex+1;
    if(utm_hasCapacity(mem, newIndex)) {
        p=(char *)mem->array+oldIndex*mem->size;
        mem->idx=newIndex;
        uprv_memset(p, 0, mem->size);
    }
    return p;
}